

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::RenderColorRectWithAlphaCheckerboard
               (ImVec2 p_min,ImVec2 p_max,ImU32 col,float grid_step,ImVec2 grid_off,float rounding,
               int rounding_corners_flags)

{
  ImDrawList *this;
  ImU32 IVar1;
  float local_84;
  ImVec2 local_70;
  ImVec2 local_68;
  uint local_60;
  float local_5c;
  int rounding_corners_flags_cell;
  float x2;
  float x1;
  float x;
  float y2;
  float y1;
  float y;
  int yi;
  ImU32 col_bg2;
  ImU32 col_bg1;
  ImGuiWindow *window;
  int rounding_corners_flags_local;
  float rounding_local;
  float grid_step_local;
  ImU32 col_local;
  ImVec2 grid_off_local;
  ImVec2 p_max_local;
  ImVec2 p_min_local;
  
  window._0_4_ = rounding_corners_flags;
  window._4_4_ = rounding;
  rounding_corners_flags_local = (int)grid_step;
  rounding_local = (float)col;
  _grid_step_local = grid_off;
  grid_off_local = p_max;
  p_max_local = p_min;
  _col_bg2 = GetCurrentWindow();
  if ((uint)rounding_local >> 0x18 < 0xff) {
    IVar1 = ImAlphaBlendColor(0xffcccccc,(ImU32)rounding_local);
    yi = GetColorU32(IVar1);
    IVar1 = ImAlphaBlendColor(0xff808080,(ImU32)rounding_local);
    y = (float)GetColorU32(IVar1);
    ImDrawList::AddRectFilled
              (_col_bg2->DrawList,&p_max_local,&grid_off_local,yi,window._4_4_,(uint)window);
    y1 = 0.0;
    for (y2 = p_max_local.y + (float)col_local; y2 < grid_off_local.y;
        y2 = (float)rounding_corners_flags_local + y2) {
      x = ImClamp<float>(y2,p_max_local.y,grid_off_local.y);
      x1 = ImMin<float>(y2 + (float)rounding_corners_flags_local,grid_off_local.y);
      if (x < x1) {
        for (x2 = (float)((uint)y1 & 1) * (float)rounding_corners_flags_local +
                  p_max_local.x + grid_step_local; x2 < grid_off_local.x;
            x2 = (float)rounding_corners_flags_local + (float)rounding_corners_flags_local + x2) {
          rounding_corners_flags_cell = (int)ImClamp<float>(x2,p_max_local.x,grid_off_local.x);
          local_5c = ImMin<float>(x2 + (float)rounding_corners_flags_local,grid_off_local.x);
          if ((float)rounding_corners_flags_cell < local_5c) {
            local_60 = 0;
            if ((x <= p_max_local.y) &&
               (local_60 = (uint)((float)rounding_corners_flags_cell <= p_max_local.x),
               grid_off_local.x <= local_5c)) {
              local_60 = local_60 | 2;
            }
            if (grid_off_local.y <= x1) {
              if ((float)rounding_corners_flags_cell <= p_max_local.x) {
                local_60 = local_60 | 4;
              }
              if (grid_off_local.x <= local_5c) {
                local_60 = local_60 | 8;
              }
            }
            local_60 = (uint)window & local_60;
            this = _col_bg2->DrawList;
            ImVec2::ImVec2(&local_68,(float)rounding_corners_flags_cell,x);
            ImVec2::ImVec2(&local_70,local_5c,x1);
            if (local_60 == 0) {
              local_84 = 0.0;
            }
            else {
              local_84 = window._4_4_;
            }
            ImDrawList::AddRectFilled(this,&local_68,&local_70,(ImU32)y,local_84,local_60);
          }
        }
      }
      y1 = (float)((int)y1 + 1);
    }
  }
  else {
    ImDrawList::AddRectFilled
              (_col_bg2->DrawList,&p_max_local,&grid_off_local,(ImU32)rounding_local,window._4_4_,
               (uint)window);
  }
  return;
}

Assistant:

void ImGui::RenderColorRectWithAlphaCheckerboard(ImVec2 p_min, ImVec2 p_max, ImU32 col, float grid_step, ImVec2 grid_off, float rounding, int rounding_corners_flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (((col & IM_COL32_A_MASK) >> IM_COL32_A_SHIFT) < 0xFF)
    {
        ImU32 col_bg1 = GetColorU32(ImAlphaBlendColor(IM_COL32(204,204,204,255), col));
        ImU32 col_bg2 = GetColorU32(ImAlphaBlendColor(IM_COL32(128,128,128,255), col));
        window->DrawList->AddRectFilled(p_min, p_max, col_bg1, rounding, rounding_corners_flags);

        int yi = 0;
        for (float y = p_min.y + grid_off.y; y < p_max.y; y += grid_step, yi++)
        {
            float y1 = ImClamp(y, p_min.y, p_max.y), y2 = ImMin(y + grid_step, p_max.y);
            if (y2 <= y1)
                continue;
            for (float x = p_min.x + grid_off.x + (yi & 1) * grid_step; x < p_max.x; x += grid_step * 2.0f)
            {
                float x1 = ImClamp(x, p_min.x, p_max.x), x2 = ImMin(x + grid_step, p_max.x);
                if (x2 <= x1)
                    continue;
                int rounding_corners_flags_cell = 0;
                if (y1 <= p_min.y) { if (x1 <= p_min.x) rounding_corners_flags_cell |= ImDrawCornerFlags_TopLeft; if (x2 >= p_max.x) rounding_corners_flags_cell |= ImDrawCornerFlags_TopRight; }
                if (y2 >= p_max.y) { if (x1 <= p_min.x) rounding_corners_flags_cell |= ImDrawCornerFlags_BotLeft; if (x2 >= p_max.x) rounding_corners_flags_cell |= ImDrawCornerFlags_BotRight; }
                rounding_corners_flags_cell &= rounding_corners_flags;
                window->DrawList->AddRectFilled(ImVec2(x1,y1), ImVec2(x2,y2), col_bg2, rounding_corners_flags_cell ? rounding : 0.0f, rounding_corners_flags_cell);
            }
        }
    }
    else
    {
        window->DrawList->AddRectFilled(p_min, p_max, col, rounding, rounding_corners_flags);
    }
}